

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_link.c
# Opt level: O0

int metacall_link_initialize(void)

{
  int iVar1;
  detour ppVar2;
  _func_void *unaff_retaddr;
  detour d;
  detour compare_cb;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  metacall_detour();
  ppVar2 = detour_create((char *)0x13b8a1);
  iVar1 = threading_mutex_initialize((threading_mutex)0x13b8b2);
  if (iVar1 == 0) {
    compare_cb = ppVar2;
    if (detour_link_handle == (detour_handle)0x0) {
      metacall_link_func();
      detour_link_handle =
           detour_install(d,unaff_retaddr,
                          (_func_void *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (detour_link_handle == (detour_handle)0x0) {
        log_write_impl_va("metacall",0x93,"metacall_link_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                          ,LOG_LEVEL_ERROR,"MetaCall invalid detour link installation",ppVar2);
        metacall_link_destroy();
        return 1;
      }
    }
    if ((metacall_link_table == (set)0x0) &&
       (metacall_link_table =
             set_create((set_cb_hash)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (set_cb_compare)compare_cb), metacall_link_table == (set)0x0)) {
      log_write_impl_va("metacall",0xa1,"metacall_link_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                        ,LOG_LEVEL_ERROR,"MetaCall failed to create link table");
      metacall_link_destroy();
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    log_write_impl_va("metacall",0x88,"metacall_link_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                      ,LOG_LEVEL_ERROR,"MetaCall invalid link mutex initialization");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int metacall_link_initialize(void)
{
	detour d = detour_create(metacall_detour());

	if (threading_mutex_initialize(&link_mutex) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid link mutex initialization");

		return 1;
	}

	if (detour_link_handle == NULL)
	{
		detour_link_handle = detour_install(d, (void (*)(void))metacall_link_func(), (void (*)(void))(&metacall_link_hook));

		if (detour_link_handle == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour link installation");

			metacall_link_destroy();

			return 1;
		}
	}

	if (metacall_link_table == NULL)
	{
		metacall_link_table = set_create(&hash_callback_str, &comparable_callback_str);

		if (metacall_link_table == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to create link table");

			metacall_link_destroy();

			return 1;
		}
	}

	return 0;
}